

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O2

bool GetProxy(Network net,Proxy *proxyInfoOut)

{
  bool bVar1;
  long in_FS_OFFSET;
  UniqueLock<GlobalMutex> criticalblock6;
  unique_lock<std::mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (NET_INTERNAL < net) {
    __assert_fail("net >= 0 && net < NET_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
                  ,0x2b2,"bool GetProxy(enum Network, Proxy &)");
  }
  UniqueLock<GlobalMutex>::UniqueLock
            ((UniqueLock<GlobalMutex> *)&local_30,&g_proxyinfo_mutex,"g_proxyinfo_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
             ,0x2b3,false);
  bVar1 = Proxy::IsValid(proxyInfo + net);
  if (bVar1) {
    Proxy::operator=(proxyInfoOut,proxyInfo + net);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool GetProxy(enum Network net, Proxy &proxyInfoOut) {
    assert(net >= 0 && net < NET_MAX);
    LOCK(g_proxyinfo_mutex);
    if (!proxyInfo[net].IsValid())
        return false;
    proxyInfoOut = proxyInfo[net];
    return true;
}